

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_IndexedTriangleStripSet(X3DImporter *this)

{
  int *__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FIReader *pFVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pNode;
  int *piVar10;
  runtime_error *this_00;
  CX3DImporter_NodeElement *pCVar11;
  pointer piVar12;
  iterator iVar13;
  char *__end;
  string *psVar14;
  int pAttrIdx;
  ulong uVar15;
  size_t *psVar16;
  string an;
  int32_t idx [3];
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> index;
  string def;
  string use;
  bool local_cc;
  bool local_cb;
  bool local_ca;
  bool local_c9;
  string local_c0;
  int local_9c [3];
  CX3DImporter_NodeElement *local_90;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_90 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar7 < 1) {
    local_ca = true;
    local_cb = true;
    local_c9 = true;
    local_cc = true;
  }
  else {
    uVar15 = 0;
    local_cc = true;
    local_c9 = true;
    local_cb = true;
    local_ca = true;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar15;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar15);
      std::__cxx11::string::string
                ((string *)&local_c0,(char *)CONCAT44(extraout_var,iVar8),(allocator *)local_9c);
      iVar8 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar14 = &local_70;
LAB_0068f296:
        pcVar3 = (char *)psVar14->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar3,(ulong)__s);
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar14 = &local_50;
          goto LAB_0068f296;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_c0);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_c0), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_c0), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar8 == 0) {
            local_cc = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar8 == 0) {
              local_c9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)&local_c0);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,pAttrIdx,&local_88);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                if (iVar8 == 0) {
                  local_ca = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                  if (iVar8 == 0) {
                    local_cb = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_c0);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      uVar15 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
  }
  if (local_50._M_string_length == 0) {
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,
                 "IndexedTriangleStripSet must contain not empty \"index\" attribute.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_c0);
      *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pNode = (CX3DImporter_NodeElement *)operator_new(0xf0);
    pCVar11 = this->NodeElement_Cur;
    pNode->Type = ENET_IndexedTriangleStripSet;
    (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
    (pNode->ID)._M_string_length = 0;
    (pNode->ID).field_2._M_local_buf[0] = '\0';
    pNode->Parent = pCVar11;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    *(CX3DImporter_NodeElement **)&pNode[1].Type = pNode + 1;
    pNode[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(pNode + 1);
    pNode[1].ID._M_dataplus._M_p = (pointer)0x0;
    pNode[1].ID._M_string_length = 0;
    pNode[1].ID.field_2._M_local_buf[0] = '\x01';
    pNode->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_IndexedSet_008ca8e0;
    *(undefined8 *)((long)&pNode[1].ID.field_2 + 8) = 0;
    pNode[1].Parent = (CX3DImporter_NodeElement *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pNode[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&pNode[2].Type = 0;
    pNode[2].ID._M_string_length = 0;
    pNode[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pNode[2].ID.field_2 + 8) = 0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_90 = pNode;
    if (local_70._M_string_length == 0) {
      pNode[1].ID.field_2._M_local_buf[1] = local_cc;
      *(bool *)&pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev = local_c9;
      *(bool *)&pNode[2].Parent = local_ca;
      pNode[1].ID.field_2._M_local_buf[0] = local_cb;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&pNode->ID);
      pp_Var4 = (_func_int **)
                pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      pp_Var5 = pNode[2]._vptr_CX3DImporter_NodeElement;
      pNode[1].ID.field_2._M_local_buf[1] = local_cc;
      *(bool *)&pNode[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev = local_c9;
      *(bool *)&pNode[2].Parent = local_ca;
      pNode[1].ID.field_2._M_local_buf[0] = local_cb;
      if (pp_Var5 != pp_Var4) {
        pNode[2]._vptr_CX3DImporter_NodeElement = pp_Var4;
      }
    }
    pCVar11 = pNode + 2;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      psVar16 = &pNode[1].Child.
                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                 ._M_impl._M_node._M_size;
      uVar7 = 0;
      __args = local_9c + 1;
      piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar12 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        local_9c[2] = *piVar12;
        if (*piVar12 < 0) {
          uVar7 = 0;
        }
        else {
          if (1 < (int)uVar7) {
            iVar13._M_current = (int *)pNode[2]._vptr_CX3DImporter_NodeElement;
            if (local_cc == false) {
              if (iVar13._M_current == *(int **)&pNode[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar16,iVar13,local_9c);
                iVar13._M_current = (int *)pCVar11->_vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar13._M_current = local_9c[0];
                iVar13._M_current = (int *)((long)pCVar11->_vptr_CX3DImporter_NodeElement + 4);
                pCVar11->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar13._M_current;
              }
              piVar10 = __args;
              if (iVar13._M_current == *(int **)&pNode[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar16,iVar13,local_9c + 2);
                iVar13._M_current = (int *)pCVar11->_vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar13._M_current = local_9c[2];
                iVar13._M_current = (int *)((long)pCVar11->_vptr_CX3DImporter_NodeElement + 4);
                pCVar11->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar13._M_current;
              }
            }
            else {
              if (iVar13._M_current == *(int **)&pNode[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar16,iVar13,local_9c);
                iVar13._M_current = (int *)pCVar11->_vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar13._M_current = local_9c[0];
                iVar13._M_current = (int *)((long)pCVar11->_vptr_CX3DImporter_NodeElement + 4);
                pCVar11->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar13._M_current;
              }
              if (iVar13._M_current == *(int **)&pNode[2].Type) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)psVar16,iVar13,__args);
                iVar13._M_current = (int *)pCVar11->_vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar13._M_current = local_9c[1];
                iVar13._M_current = (int *)((long)pCVar11->_vptr_CX3DImporter_NodeElement + 4);
                pCVar11->_vptr_CX3DImporter_NodeElement = (_func_int **)iVar13._M_current;
              }
              piVar10 = local_9c + 2;
            }
            if (iVar13._M_current == *(int **)&pNode[2].Type) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)psVar16,iVar13,piVar10);
            }
            else {
              *iVar13._M_current = *piVar10;
              pCVar11->_vptr_CX3DImporter_NodeElement =
                   (_func_int **)((long)pCVar11->_vptr_CX3DImporter_NodeElement + 4);
            }
            local_c0._M_dataplus._M_p._0_4_ = 0xffffffff;
            iVar13._M_current = (int *)pNode[2]._vptr_CX3DImporter_NodeElement;
            if (iVar13._M_current == *(int **)&pNode[2].Type) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar16,iVar13,(int *)&local_c0);
              piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            else {
              *iVar13._M_current = -1;
              pCVar11->_vptr_CX3DImporter_NodeElement =
                   (_func_int **)((long)pCVar11->_vptr_CX3DImporter_NodeElement + 4);
              piVar10 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
          }
          local_9c[uVar7 & 1] = local_9c[2];
          uVar7 = uVar7 + 1;
        }
        piVar12 = piVar12 + 1;
      } while (piVar12 != piVar10);
    }
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar8 == '\0') {
      ParseHelper_Node_Enter(this,pNode);
      paVar1 = &local_c0.field_2;
      do {
        do {
          while( true ) {
            iVar8 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar8 == '\0') {
              local_c0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c0,"IndexedTriangleStripSet","");
              Throw_CloseNotFound(this,&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar1) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              goto LAB_0068f9dd;
            }
            iVar8 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar8 != 1) break;
            local_c0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Color","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar8 = std::__cxx11::string::compare((char *)&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            if (iVar8 == 0) {
              ParseNode_Rendering_Color(this);
            }
            else {
              local_c0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ColorRGBA","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar8 = std::__cxx11::string::compare((char *)&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar1) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              if (iVar8 == 0) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                local_c0._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Coordinate","")
                ;
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != paVar1) {
                  operator_delete(local_c0._M_dataplus._M_p);
                }
                if (iVar8 == 0) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  local_c0._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Normal","");
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != paVar1) {
                    operator_delete(local_c0._M_dataplus._M_p);
                  }
                  if (iVar8 == 0) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    local_c0._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_c0,"TextureCoordinate","");
                    (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar8 = std::__cxx11::string::compare((char *)&local_c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c0._M_dataplus._M_p != paVar1) {
                      operator_delete(local_c0._M_dataplus._M_p);
                    }
                    if (iVar8 == 0) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar6 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar6) {
                        local_c0._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_c0,"IndexedTriangleStripSet","");
                        XML_CheckNode_SkipUnsupported(this,&local_c0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c0._M_dataplus._M_p != paVar1) {
                          operator_delete(local_c0._M_dataplus._M_p);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar8 != 2);
        local_c0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"IndexedTriangleStripSet","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar8 = std::__cxx11::string::compare((char *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      } while (iVar8 != 0);
LAB_0068f9dd:
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar11 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)pNode;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar16 = &(pCVar11->Child).
                 super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                 ._M_impl._M_node._M_size;
      *psVar16 = *psVar16 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar16 = &(this->NodeElement_List).
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node._M_size;
    *psVar16 = *psVar16 + 1;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_50,ENET_IndexedTriangleStripSet,&local_90);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar11 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_90;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar16 = &(pCVar11->Child).
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node._M_size;
    *psVar16 = *psVar16 + 1;
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_IndexedTriangleStripSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> index;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("index", index, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_IndexedTriangleStripSet, ne);
	}
	else
	{
		// check data
		if(index.size() == 0) throw DeadlyImportError("IndexedTriangleStripSet must contain not empty \"index\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ne_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;

		ne_alias.CoordIndex.clear();
		int counter = 0;
		int32_t idx[3];
		for(std::vector<int32_t>::const_iterator idx_it = index.begin(); idx_it != index.end(); ++idx_it)
		{
			idx[2] = *idx_it;
			if (idx[2] < 0)
			{
				counter = 0;
			}
			else
			{
				if (counter >= 2)
				{
					if(ccw)
					{
						ne_alias.CoordIndex.push_back(idx[0]);
						ne_alias.CoordIndex.push_back(idx[1]);
						ne_alias.CoordIndex.push_back(idx[2]);
					}
					else
					{
						ne_alias.CoordIndex.push_back(idx[0]);
						ne_alias.CoordIndex.push_back(idx[2]);
						ne_alias.CoordIndex.push_back(idx[1]);
					}
					ne_alias.CoordIndex.push_back(-1);
				}
				idx[counter & 1] = idx[2];
				++counter;
			}
		}// for(std::list<int32_t>::const_iterator idx_it = index.begin(); idx_it != ne_alias.index.end(); idx_it++)

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("IndexedTriangleStripSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("IndexedTriangleStripSet");

			MACRO_NODECHECK_LOOPEND("IndexedTriangleStripSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}